

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase271::TestCase271(TestCase271 *this)

{
  TestCase271 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-async-test.c++"
             ,0x10f,"legacy test: SerializeAsyncTest/WriteAsync");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00cc0618;
  return;
}

Assistant:

TEST(SerializeAsyncTest, WriteAsync) {
  PipeWithSmallBuffer fds;
  auto ioContext = kj::setupAsyncIo();
  auto output = ioContext.lowLevelProvider->wrapOutputFd(fds[1]);

  TestMessageBuilder message(1);
  auto root = message.getRoot<TestAllTypes>();
  auto list = root.initStructList(16);
  for (auto element: list) {
    initTestMessage(element);
  }

  kj::Thread thread([&]() {
    SocketInputStream input(fds[0]);
    InputStreamMessageReader reader(input);
    auto listReader = reader.getRoot<TestAllTypes>().getStructList();
    EXPECT_EQ(list.size(), listReader.size());
    for (auto element: listReader) {
      checkTestMessage(element);
    }
  });

  writeMessage(*output, message).wait(ioContext.waitScope);
}